

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bufq.c
# Opt level: O1

ssize_t Curl_bufq_write_pass
                  (bufq *q,uchar *buf,size_t len,Curl_bufq_writer *writer,void *writer_ctx,
                  CURLcode *err)

{
  buf_chunk *pbVar1;
  ssize_t sVar2;
  CURLcode CVar3;
  long lVar4;
  bool bVar5;
  
  *err = CURLE_OK;
  bVar5 = len != 0;
  if (len == 0) {
    lVar4 = 0;
  }
  else {
    lVar4 = 0;
    do {
      pbVar1 = q->tail;
      if ((pbVar1 != (buf_chunk *)0x0) && (q->spare == (buf_chunk *)0x0)) {
        if ((q->chunk_count < q->max_chunks) ||
           (((q->chunk_count <= q->max_chunks && (pbVar1->w_offset < pbVar1->dlen)) ||
            (sVar2 = Curl_bufq_pass(q,writer,writer_ctx,err), -1 < sVar2)))) goto LAB_00112f99;
LAB_00112fc7:
        if (*err != CURLE_AGAIN) {
          return -1;
        }
        break;
      }
LAB_00112f99:
      sVar2 = Curl_bufq_write(q,buf,len,err);
      if (sVar2 < 0) goto LAB_00112fc7;
      if (sVar2 == 0) break;
      buf = buf + sVar2;
      lVar4 = lVar4 + sVar2;
      len = len - sVar2;
      bVar5 = len != 0;
    } while (bVar5);
  }
  bVar5 = (bool)(bVar5 & lVar4 == 0);
  CVar3 = CURLE_OK;
  if (bVar5) {
    CVar3 = CURLE_AGAIN;
  }
  sVar2 = -1;
  if (!bVar5) {
    sVar2 = lVar4;
  }
  *err = CVar3;
  return sVar2;
}

Assistant:

ssize_t Curl_bufq_write_pass(struct bufq *q,
                             const unsigned char *buf, size_t len,
                             Curl_bufq_writer *writer, void *writer_ctx,
                             CURLcode *err)
{
  ssize_t nwritten = 0, n;

  *err = CURLE_OK;
  while(len) {
    if(Curl_bufq_is_full(q)) {
      /* try to make room in case we are full */
      n = Curl_bufq_pass(q, writer, writer_ctx, err);
      if(n < 0) {
        if(*err != CURLE_AGAIN) {
          /* real error, fail */
          return -1;
        }
        /* would block, bufq is full, give up */
        break;
      }
    }

    /* Add whatever is remaining now to bufq */
    n = Curl_bufq_write(q, buf, len, err);
    if(n < 0) {
      if(*err != CURLE_AGAIN) {
        /* real error, fail */
        return -1;
      }
      /* no room in bufq */
      break;
    }
    /* edge case of writer returning 0 (and len is >0)
     * break or we might enter an infinite loop here */
    if(n == 0)
      break;

    /* Maybe only part of `data` has been added, continue to loop */
    buf += (size_t)n;
    len -= (size_t)n;
    nwritten += (size_t)n;
  }

  if(!nwritten && len) {
    *err = CURLE_AGAIN;
    return -1;
  }
  *err = CURLE_OK;
  return nwritten;
}